

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O2

RK_S32 vdpu384a_set_rcbinfo(MppDev dev,Vdpu384aRcbInfo *rcb_info)

{
  long lVar1;
  MppDevRcbInfoCfg rcb_cfg;
  
  for (lVar1 = 0; lVar1 != 0x2c; lVar1 = lVar1 + 4) {
    rcb_cfg.size = rcb_info[*(uint *)((long)&DAT_002b3aa0 + lVar1)].size;
    rcb_cfg.reg_idx = rcb_info[*(uint *)((long)&DAT_002b3aa0 + lVar1)].reg_idx;
    if (rcb_info[*(uint *)((long)&DAT_002b3aa0 + lVar1)].size != 0) {
      mpp_dev_ioctl(dev,8,&rcb_cfg);
    }
  }
  return 0;
}

Assistant:

RK_S32 vdpu384a_set_rcbinfo(MppDev dev, Vdpu384aRcbInfo *rcb_info)
{
    MppDevRcbInfoCfg rcb_cfg;
    RK_U32 i;

    Vdpu384aRcbSetMode_e set_rcb_mode = RCB_SET_BY_PRIORITY_MODE;

    RK_U32 rcb_priority[RCB_BUF_COUNT] = {
        RCB_FILTERD_ROW,
        RCB_INTER_ROW,
        RCB_INTRA_ROW,
        RCB_STRMD_ROW,
        RCB_INTER_TILE_ROW,
        RCB_INTRA_TILE_ROW,
        RCB_STRMD_TILE_ROW,
        RCB_FILTERD_TILE_ROW,
        RCB_FILTERD_TILE_COL,
        RCB_FILTERD_AV1_UP_TILE_COL,
        RCB_FILTERD_PROTECT_ROW,
    };
    /*
     * RCB_SET_BY_SIZE_SORT_MODE: by size sort
     * RCB_SET_BY_PRIORITY_MODE: by priority
     */

    switch (set_rcb_mode) {
    case RCB_SET_BY_SIZE_SORT_MODE : {
        Vdpu384aRcbInfo info[RCB_BUF_COUNT];

        memcpy(info, rcb_info, sizeof(info));
        qsort(info, MPP_ARRAY_ELEMS(info),
              sizeof(info[0]), vdpu384a_compare_rcb_size);

        for (i = 0; i < MPP_ARRAY_ELEMS(info); i++) {
            rcb_cfg.reg_idx = info[i].reg_idx;
            rcb_cfg.size = info[i].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            } else
                break;
        }
    } break;
    case RCB_SET_BY_PRIORITY_MODE : {
        Vdpu384aRcbInfo *info = rcb_info;
        RK_U32 index = 0;

        for (i = 0; i < MPP_ARRAY_ELEMS(rcb_priority); i ++) {
            index = rcb_priority[i];

            rcb_cfg.reg_idx = info[index].reg_idx;
            rcb_cfg.size = info[index].size;
            if (rcb_cfg.size > 0) {
                mpp_dev_ioctl(dev, MPP_DEV_RCB_INFO, &rcb_cfg);
            }
        }
    } break;
    default:
        break;
    }

    return 0;
}